

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moves_sort.cpp
# Opt level: O2

void SortRootMove(int num_of_all_movements,Movement *all_movements)

{
  long lVar1;
  ulong uVar2;
  
  lVar1 = 0;
  uVar2 = 0;
  if (0 < num_of_all_movements) {
    uVar2 = (ulong)(uint)num_of_all_movements;
  }
  for (; uVar2 * 0xc - lVar1 != 0; lVar1 = lVar1 + 0xc) {
    if (*(uint *)((long)&all_movements->value + lVar1) < 0x7fffffe8) {
      *(UINT32 *)((long)&all_movements->value + lVar1) =
           HistoryTable[(&all_movements->from)[lVar1]][(&all_movements->to)[lVar1]];
    }
  }
  std::__sort<Movement*,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Movement&,Movement&)>>
            (all_movements,all_movements + num_of_all_movements,
             (_Iter_comp_iter<bool_(*)(Movement_&,_Movement_&)>)0x106c80);
  return;
}

Assistant:

void SortRootMove(int num_of_all_movements, Movement* all_movements){
    // 对着法做历史表启发
    for(int i = 0; i < num_of_all_movements; i++){
        if(all_movements[i].value < MAX_MOVE_VALUE - 24){
            all_movements[i].value = HistoryTable[all_movements[i].from][all_movements[i].to];
        }
    }
    std::sort(all_movements, all_movements + num_of_all_movements, cmp);
}